

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annex_storage.h
# Opt level: O1

value_t __thiscall
lume::AnnexStorage<lume::Mesh::AnnexKey,lume::Annex>::optional_annex<lume::ArrayAnnex<unsigned_int>>
          (AnnexStorage<lume::Mesh::AnnexKey,lume::Annex> *this,AnnexKey *id)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_t vVar3;
  
  iVar2 = std::
          _Rb_tree<lume::Mesh::AnnexKey,_std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>,_std::_Select1st<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
          ::find((_Rb_tree<lume::Mesh::AnnexKey,_std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>,_std::_Select1st<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
                  *)id,in_RDX);
  if (iVar2._M_node == (_Base_ptr)&(id->name)._M_string_length) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(_Base_ptr *)this = iVar2._M_node[2]._M_parent;
    p_Var1 = iVar2._M_node[2]._M_left;
    *(_Base_ptr *)(this + 8) = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  vVar3.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar3.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (value_t)vVar3.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_t optional_annex (const TKey& id)
	{
		auto i = m_annexMap.find (id);
		if (i == m_annexMap.end())
			return std::shared_ptr<TConcreteType>();
		return i->second;
	}